

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22d10::ChannelOut_controlchange(lua_State *L)

{
  int iVar1;
  int iVar2;
  ChannelOut *this;
  ulong xs_1;
  ulong xs_2;
  ulong uVar3;
  int xs_2_00;
  
  this = getChannelOut(L,1);
  xs_1 = luaL_checkinteger(L,2);
  iVar1 = lua_type(L,3);
  if (iVar1 == 1) {
    if (0x77 < xs_1) {
      luaL_argerror(L,2,"Controller number must be between 0 and 119");
    }
    iVar1 = this->index;
    iVar2 = lua_toboolean(L,3);
    xs_2_00 = 0x7f;
    if (iVar2 == 0) {
      xs_2_00 = 0;
    }
    ChannelOut::send<int,long_long,int>(this,iVar1 + 0xb0,xs_1,xs_2_00);
  }
  else {
    xs_2 = luaL_checkinteger(L,3);
    iVar1 = lua_isnumber(L,4);
    if (iVar1 == 0) {
      iVar1 = lua_type(L,4);
      if ((iVar1 == 1) && (iVar1 = lua_toboolean(L,4), iVar1 != 0)) {
        if (0x1f < xs_1) {
          luaL_argerror(L,2,"Controller number must be between 0 and 31");
        }
        if (0x3fff < xs_2) {
          luaL_argerror(L,3,"Controller value must be between 0 and 16383");
        }
        ChannelOut::send<int,long_long,long_long>
                  (this,this->index + 0xb0,xs_1,(ulong)((uint)(xs_2 >> 7) & 0x7f));
        iVar1 = this->index;
        xs_1 = xs_1 + 0x20;
        xs_2 = (ulong)((uint)xs_2 & 0x7f);
      }
      else {
        if (0x77 < xs_1) {
          luaL_argerror(L,2,"Controller number must be between 0 and 119");
        }
        if (0x7f < xs_2) {
          luaL_argerror(L,3,"Controller value must be between 0 and 127");
        }
        iVar1 = this->index;
      }
    }
    else {
      uVar3 = luaL_checkinteger();
      if (0x1f < xs_1) {
        luaL_argerror(L,2,"Controller number must be between 0 and 31");
      }
      if (0x7f < uVar3) {
        luaL_argerror(L,4,"Controller value must be between 0 and 127");
      }
      ChannelOut::send<int,long_long,long_long>(this,this->index + 0xb0,xs_1,xs_2);
      iVar1 = this->index;
      xs_1 = xs_1 + 0x20;
      xs_2 = uVar3;
    }
    ChannelOut::send<int,long_long,long_long>(this,iVar1 + 0xb0,xs_1,xs_2);
  }
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_controlchange(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer cc = luaL_checkinteger(L, 2);

	if (lua_isboolean(L, 3)) {
		luaL_argcheck(L, cc >= 0 && cc <= 0x77, 2, "Controller number must be between 0 and 119");
		self.send(0xB0 + self.index, cc, lua_toboolean(L, 3) ? 0x7F : 0x00);
	}
	else {
		lua_Integer value = luaL_checkinteger(L, 3);
		if (lua_isnumber(L, 4)) {
			lua_Integer lsb = luaL_checkinteger(L, 4);
			luaL_argcheck(L, cc >= 0 && cc <= 0x1F, 2, "Controller number must be between 0 and 31");
			luaL_argcheck(L, lsb >= 0 && lsb <= 0x7F, 4, "Controller value must be between 0 and 127");
			self.send(0xB0 + self.index, cc, value);
			self.send(0xB0 + self.index, cc + 0x20, lsb);
		}
		else if (lua_isboolean(L, 4) && lua_toboolean(L, 4)) {
			luaL_argcheck(L, cc >= 0 && cc <= 0x1F, 2, "Controller number must be between 0 and 31");
			luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 3, "Controller value must be between 0 and 16383");
			self.send(0xB0 + self.index, cc, (value >> 7) & 0x7Fu);
			self.send(0xB0 + self.index, cc + 0x20, value & 0x7Fu);
		}
		else {
			luaL_argcheck(L, cc >= 0 && cc <= 0x77, 2, "Controller number must be between 0 and 119");
			luaL_argcheck(L, value >= 0 && value <= 0x7F, 3, "Controller value must be between 0 and 127");
			self.send(0xB0 + self.index, cc, value);
		}
	}

	lua_settop(L, 1);
	return 1;
}